

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osgen3.c
# Opt level: O0

int osgen_sb_mode(osgen_txtwin_t *win,int event_type,os_event_info_t *event_info)

{
  byte bVar1;
  uint uVar2;
  size_t lines;
  undefined4 *in_RDX;
  int in_ESI;
  osgen_txtwin_t *in_RDI;
  int just_started;
  char c;
  int ret;
  size_t in_stack_ffffffffffffffa8;
  osgen_txtwin_t *in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffc0;
  int iVar3;
  char *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  int local_24;
  
  iVar3 = (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20);
  if ((S_sbmode_win != (osgen_txtwin_t *)0x0) && (S_sbmode_win != in_RDI)) {
    osgen_sb_mode_end();
  }
  uVar2 = (uint)(S_sbmode_win == (osgen_txtwin_t *)0x0);
  if (uVar2 != 0) {
    if (in_RDI->txtbuf == (char *)0x0) {
      return 0;
    }
    if ((in_RDI->line_count <= (in_RDI->base).ht) || ((in_RDI->base).ht < 2)) {
      return 0;
    }
    S_sbmode_win = in_RDI;
    (in_RDI->base).winy = (in_RDI->base).winy + 1;
    (in_RDI->base).ht = (in_RDI->base).ht - 1;
    (in_RDI->base).scrolly = (in_RDI->base).scrolly + 1;
    S_sbmode_orig_x = (in_RDI->base).x;
    S_sbmode_orig_txtfree = in_RDI->txtfree;
    S_sbmode_orig_last_line = osgen_get_line_ptr(in_RDI,(in_RDI->base).y);
    ossaddsb_input((osgen_txtwin_t *)CONCAT44(uVar2,in_stack_ffffffffffffffd0),
                   in_stack_ffffffffffffffc8,iVar3);
    S_sbmode_orig_scrolly = (in_RDI->base).scrolly;
    osgen_draw_sb_mode_line();
  }
  local_24 = 1;
  if (in_ESI == 1) {
    bVar1 = (byte)*in_RDX;
    if ((((0x1f < bVar1) || (bVar1 == 10)) || (bVar1 == 0xd)) || (bVar1 == 8)) {
      osgen_sb_mode_end();
      local_24 = 0;
    }
    if (bVar1 == 0x1b) {
      osgen_sb_mode_end();
    }
    else if (bVar1 == 0) {
      iVar3 = (int)(in_stack_ffffffffffffffa8 >> 0x20);
      switch(in_RDX[1]) {
      case 1:
        osgen_scroll_win_back(in_stack_ffffffffffffffb0,iVar3);
        break;
      case 2:
        osgen_scroll_win_fwd(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
        break;
      case 8:
      case 0x20:
        osgen_sb_mode_end();
        break;
      case 10:
        if (uVar2 == 0) {
          osgen_sb_mode_end();
        }
        break;
      case 0xb:
        osgen_scroll_win_back(in_stack_ffffffffffffffb0,iVar3);
        break;
      case 0xc:
        if ((in_RDI->base).ht < 2) {
          lines = 1;
        }
        else {
          lines = (in_RDI->base).ht - 1;
        }
        osgen_scroll_win_fwd(in_RDI,lines);
      }
    }
  }
  return local_24;
}

Assistant:

static int osgen_sb_mode(osgen_txtwin_t *win, int event_type,
                         os_event_info_t *event_info)
{
    int ret;
    char c;
    int just_started;

    /* if we were doing scrollback in a different window, cancel it */
    if (S_sbmode_win != 0 && S_sbmode_win != win)
        osgen_sb_mode_end();

    /* note if we're just entering scrollback mode */
    just_started = (S_sbmode_win == 0);

    /* if scrollback mode isn't already in progress, set it up */
    if (just_started)
    {
        /* if there's no buffer, we can't enter scrollback mode */
        if (win->txtbuf == 0)
            return FALSE;

        /* 
         *   If the number of lines in the scrollback buffer doesn't exceed
         *   the number of lines displayed in the window, then don't bother
         *   entering scrollback mode.  If the window isn't at least two
         *   lines high, don't allow it either, as we need space to draw our
         *   mode line.  
         */
        if (win->line_count <= win->base.ht || win->base.ht < 2)
            return FALSE;

        /* remember the window involved in scrollback */
        S_sbmode_win = win;
        
        /* 
         *   Shrink the window one line at the top, to make room for the mode
         *   line.  Compensate by bumping the scrolling position forward a
         *   line, to keep the lines that will remain visible in the rest of
         *   the window at the same place on the screen.  
         */
        win->base.winy += 1;
        win->base.ht -= 1;
        win->base.scrolly += 1;

        /*
         *   Temporarily add the command buffer to the scrollback buffer, so
         *   that it shows up when we're scrolling.  To facilitate removing
         *   the added text later, remember the current free pointer, last
         *   line pointer, x document position.  
         */
        S_sbmode_orig_x = win->base.x;
        S_sbmode_orig_txtfree = win->txtfree;
        S_sbmode_orig_last_line = osgen_get_line_ptr(win, win->base.y);
        ossaddsb_input(win, S_gets_buf, FALSE);

        /* remember the original scrolling position */
        S_sbmode_orig_scrolly = win->base.scrolly;

        /* draw the mode line */
        osgen_draw_sb_mode_line();
    }

    /* presume we'll handle the event */
    ret = TRUE;

    /* check the event */
    switch(event_type)
    {
    case OS_EVT_KEY:
        /* 
         *   If it's a regular key, exit scrollback mode immediately, and
         *   let the caller handle the event normally.  This allows the user
         *   to resume typing even while scrollback is active; we'll simply
         *   cancel the scrollback and resume editing with the event that
         *   canceled the scrollback.  
         */
        c = event_info->key[0];
        if ((unsigned char)c >= 32 || c == '\n' || c == '\r' || c == 8)
        {
            /* it's a regular key - terminate scrollback mode */
            osgen_sb_mode_end();

            /* let the caller handle the event */
            ret = FALSE;
        }

        /* if it's the escape key, we're done */
        if (c == 27)
        {
            osgen_sb_mode_end();
            break;
        }

        /* if it's not a special keystroke, we're done with it */
        if (c != '\0')
            break;

        /* it's a special keystroke - check the command ID */
        switch(event_info->key[1])
        {
        case CMD_SCR:
            /* if we're not just toggling in to scrollback mode, toggle out */
            if (!just_started)
                osgen_sb_mode_end();
            break;
            
        case CMD_KILL:
        case CMD_EOF:
            /* it's a termination key - cancel scrollback mode */
            osgen_sb_mode_end();
            break;

        case CMD_UP:
            /* scroll back a line */
            osgen_scroll_win_back(win, 1);
            break;

        case CMD_DOWN:
            /* scroll forward a line */
            osgen_scroll_win_fwd(win, 1);
            break;
            
        case CMD_PGUP:
            /* move back by one window height */
            osgen_scroll_win_back(win, win->base.ht > 1
                                  ? win->base.ht - 1 : 1);
            break;
            
        case CMD_PGDN:
            /* move forward by one window height */
            osgen_scroll_win_fwd(win, win->base.ht > 1
                                 ? win->base.ht - 1 : 1);
            break;
        }

        /* done with the key */
        break;

    default:
        /* 
         *   ignore any other events we receive, but consider them processed
         *   - even though we're ignoring the event, we're deliberately
         *   ignoring the event as our way of processing it 
         */
        break;
    }

    /* return the 'processed' indication to the caller */
    return ret;
}